

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void make_native(Vm *vm,char *name,size_t length,void *fn_ptr,uint8_t num_params,_Bool pass_vm)

{
  VarHTItemKey key_00;
  Variable value_00;
  uint32_t uVar1;
  ObjNativeFunc *object;
  CrispyValue value_01;
  CrispyValue CVar2;
  VarHTItemKey key;
  Variable variable;
  uint8_t index_2;
  uint8_t index_1;
  uint16_t pos;
  CrispyValue value;
  ObjNativeFunc *native_func;
  _Bool pass_vm_local;
  uint8_t num_params_local;
  void *fn_ptr_local;
  size_t length_local;
  char *name_local;
  Vm *vm_local;
  
  object = new_native_func(vm,fn_ptr,num_params,pass_vm);
  CVar2 = create_object(&object->object);
  value_01.field_1 = CVar2.field_1;
  value_01._4_4_ = 0;
  value_01.type = CVar2.type;
  uVar1 = add_constant(vm,value_01);
  if ((ushort)uVar1 < 0x100) {
    emit_byte_arg(vm,OP_LDC,(uint8_t)uVar1);
  }
  else {
    emit_short_arg(vm,OP_LDC_W,(uint8_t)(uVar1 >> 8),(uint8_t)uVar1);
  }
  uVar1 = (vm->compiler).vars_in_scope;
  (vm->compiler).vars_in_scope = uVar1 + 1;
  variable.scope = variable.scope & 0xffffff00;
  key_00.ident_length = length;
  key_00.key_ident_string = name;
  value_00.scope = (vm->compiler).scope_depth;
  value_00.index = uVar1;
  value_00.frame_offset = vm->frame_count;
  value_00._12_4_ = variable.scope;
  var_ht_put((vm->compiler).scope,key_00,value_00);
  emit_byte_arg(vm,OP_STORE,(uint8_t)uVar1);
  return;
}

Assistant:

static void make_native(Vm *vm, const char *name, size_t length, void *fn_ptr, uint8_t num_params, bool pass_vm) {
    ObjNativeFunc *native_func = new_native_func(vm, fn_ptr, num_params, pass_vm);
    CrispyValue value = create_object((Object *) native_func);

    uint16_t pos = (uint16_t) add_constant(vm, value);

    if (pos > UINT8_MAX) {
        uint8_t index_1 = (uint8_t) (pos >> 8);
        uint8_t index_2 = (uint8_t) (pos & 0xFF);
        emit_short_arg(vm, OP_LDC_W, index_1, index_2);
    } else {
        emit_byte_arg(vm, OP_LDC, (uint8_t) pos);
    }

    Variable variable = {vm->compiler.vars_in_scope++, vm->compiler.scope_depth, (int) vm->frame_count, false};
    VarHTItemKey key = {name, length};
    var_ht_put(&vm->compiler.scope[0], key, variable);
    emit_byte_arg(vm, OP_STORE, (uint8_t) variable.index);

    // TODO if first statement in interactive mode causes an error: this bytecode will never be executed and any access segfaults
}